

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::WFXMLScanner::cleanUp(WFXMLScanner *this)

{
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  ValueVectorOf<unsigned_long> *this_01;
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *this_02;
  RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *this_03;
  XMLAttr **in_RSI;
  
  this_00 = this->fEntityTable;
  if (this_00 != (ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) {
    ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::~ValueHashTableOf(this_00);
  }
  XMemory::operator_delete((XMemory *)this_00,in_RSI);
  this_01 = this->fAttrNameHashList;
  if (this_01 != (ValueVectorOf<unsigned_long> *)0x0) {
    in_RSI = (XMLAttr **)this_01->fElemList;
    (*this_01->fMemoryManager->_vptr_MemoryManager[4])();
  }
  XMemory::operator_delete((XMemory *)this_01,in_RSI);
  this_02 = this->fAttrNSList;
  if (this_02 != (ValueVectorOf<xercesc_4_0::XMLAttr_*> *)0x0) {
    in_RSI = this_02->fElemList;
    (*this_02->fMemoryManager->_vptr_MemoryManager[4])();
  }
  XMemory::operator_delete((XMemory *)this_02,in_RSI);
  this_03 = this->fElementLookup;
  if (this_03 != (RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
    RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher>::~RefHashTableOf(this_03)
    ;
  }
  XMemory::operator_delete((XMemory *)this_03,in_RSI);
  if (this->fElements != (RefVectorOf<xercesc_4_0::XMLElementDecl> *)0x0) {
    (*(this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>)._vptr_BaseRefVectorOf[1]
    )();
    return;
  }
  return;
}

Assistant:

void WFXMLScanner::cleanUp()
{
    delete fEntityTable;
    delete fAttrNameHashList;
    delete fAttrNSList;
    delete fElementLookup;
    delete fElements;
}